

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEnable.c
# Opt level: O0

void Gia_CollectSuper(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vSuper)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  Vec_Int_t *vSuper_local;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_IsComplement(pObj);
  if (iVar1 == 0) {
    Vec_IntClear(vSuper);
    iVar1 = Gia_ObjIsAnd(pObj);
    if (iVar1 == 0) {
      pGVar2 = Gia_Regular(pObj);
      iVar1 = Gia_ObjId(p,pGVar2);
      Vec_IntPushUnique(vSuper,iVar1);
    }
    else {
      pGVar2 = Gia_ObjFanin0(pObj);
      iVar1 = Gia_ObjId(p,pGVar2);
      Vec_IntPushUnique(vSuper,iVar1);
      pGVar2 = Gia_ObjFanin1(pObj);
      iVar1 = Gia_ObjId(p,pGVar2);
      Vec_IntPushUnique(vSuper,iVar1);
    }
    return;
  }
  __assert_fail("!Gia_IsComplement(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaEnable.c"
                ,0x48,"void Gia_CollectSuper(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
}

Assistant:

void Gia_CollectSuper( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vSuper )
{
    assert( !Gia_IsComplement(pObj) );
    Vec_IntClear( vSuper );
//    Gia_CollectSuper_rec( p, pObj, vSuper );
    if ( Gia_ObjIsAnd(pObj) )
    {
        Vec_IntPushUnique( vSuper, Gia_ObjId(p, Gia_ObjFanin0(pObj)) );
        Vec_IntPushUnique( vSuper, Gia_ObjId(p, Gia_ObjFanin1(pObj)) );
    }
    else
        Vec_IntPushUnique( vSuper, Gia_ObjId(p, Gia_Regular(pObj)) );

}